

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O2

int Ssw_ManSweepBmcConstr(Ssw_Man_t *p)

{
  uint uVar1;
  abctime aVar2;
  Aig_Man_t *pAVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  abctime aVar6;
  int fBmc;
  Aig_Man_t *pAVar7;
  int iVar8;
  int i;
  int iVar9;
  Aig_Obj_t *pAVar10;
  int iVar11;
  int i_00;
  
  aVar2 = Abc_Clock();
  pAVar3 = Aig_ManStart(p->pPars->nFramesK * p->pAig->vObjs->nSize);
  p->pFrames = pAVar3;
  for (iVar8 = 0; pAVar3 = p->pAig, iVar8 < pAVar3->nRegs; iVar8 = iVar8 + 1) {
    pvVar4 = Vec_PtrEntry(pAVar3->vCis,pAVar3->nTruePis + iVar8);
    p->pNodeToFrames[(long)*(int *)((long)pvVar4 + 0x24) * (long)p->nFrames] =
         (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1);
  }
  p->fRefined = 0;
  iVar8 = 0;
  iVar9 = 0;
  do {
    i_00 = iVar8;
    if (p->pPars->nFramesK <= i_00) {
LAB_0055e08e:
      if (p->vInits->nSize != iVar9 + pAVar3->nTruePis) {
        __assert_fail("Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswConstr.c"
                      ,0x231,"int Ssw_ManSweepBmcConstr(Ssw_Man_t *)");
      }
      aVar6 = Abc_Clock();
      p->timeBmc = p->timeBmc + (aVar6 - aVar2);
      return p->fRefined;
    }
    pAVar7 = (Aig_Man_t *)p->pFrames->pConst1;
    p->pNodeToFrames[pAVar3->pConst1->Id * p->nFrames + i_00] = (Aig_Obj_t *)pAVar7;
    iVar8 = 0;
    while( true ) {
      i = iVar9 + iVar8;
      pAVar3 = p->pAig;
      if (pAVar3->nTruePis <= iVar8) break;
      pvVar4 = Vec_PtrEntry(pAVar3->vCis,iVar8);
      pAVar5 = Aig_ObjCreateCi(p->pFrames);
      uVar1 = Vec_IntEntry(p->vInits,i);
      *(ulong *)&pAVar5->field_0x18 =
           (*(ulong *)&pAVar5->field_0x18 & 0xfffffffffffffff7) + (ulong)(uVar1 & 1) * 8;
      pAVar7 = (Aig_Man_t *)(long)(*(int *)((long)pvVar4 + 0x24) * p->nFrames + i_00);
      p->pNodeToFrames[(long)pAVar7] = pAVar5;
      iVar8 = iVar8 + 1;
    }
    for (iVar11 = 0; iVar11 < pAVar3->nTruePos; iVar11 = iVar11 + 1) {
      pvVar4 = Vec_PtrEntry(pAVar3->vCos,iVar11);
      uVar1 = p->pAig->nTruePos - p->pAig->nConstrs;
      pAVar7 = (Aig_Man_t *)(ulong)uVar1;
      if ((int)uVar1 <= iVar11) {
        pAVar5 = Ssw_ManSweepBmcConstr_rec
                           (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe),i_00)
        ;
        pAVar10 = (Aig_Obj_t *)
                  ((ulong)((uint)*(undefined8 *)((long)pvVar4 + 8) & 1) ^ (ulong)pAVar5);
        pAVar7 = p->pFrames;
        if (pAVar7->pConst1 == (Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe)) {
          if (((ulong)pAVar10 & 1) == 0) {
            __assert_fail("Aig_IsComplement(pObjNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswConstr.c"
                          ,0x214,"int Ssw_ManSweepBmcConstr(Ssw_Man_t *)");
          }
        }
        else {
          Ssw_NodesAreConstrained(p,pAVar10,(Aig_Obj_t *)((ulong)pAVar7->pConst1 ^ 1));
        }
      }
      pAVar3 = p->pAig;
    }
    for (iVar11 = 0; iVar11 < pAVar3->nRegs; iVar11 = iVar11 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vCis,pAVar3->nTruePis + iVar11);
      uVar1 = Ssw_ManSweepNodeConstr(p,pAVar5,i_00,(int)pAVar7);
      p->fRefined = p->fRefined | uVar1;
      pAVar3 = p->pAig;
    }
    for (iVar11 = 0; iVar11 < pAVar3->vObjs->nSize; iVar11 = iVar11 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vObjs,iVar11);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        pAVar3 = p->pFrames;
        pAVar10 = Ssw_ObjChild0Fra(p,pAVar5,i_00);
        p1 = Ssw_ObjChild1Fra(p,pAVar5,i_00);
        pAVar10 = Aig_And(pAVar3,pAVar10,p1);
        fBmc = pAVar5->Id * p->nFrames + i_00;
        p->pNodeToFrames[fBmc] = pAVar10;
        uVar1 = Ssw_ManSweepNodeConstr(p,pAVar5,i_00,fBmc);
        p->fRefined = p->fRefined | uVar1;
      }
      pAVar3 = p->pAig;
    }
    if (i_00 == p->pPars->nFramesK + -1) {
      iVar9 = iVar9 + iVar8;
      goto LAB_0055e08e;
    }
    for (iVar8 = 0; iVar8 < pAVar3->vCos->nSize; iVar8 = iVar8 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vCos,iVar8);
      pAVar10 = Ssw_ObjChild0Fra(p,pAVar5,i_00);
      p->pNodeToFrames[pAVar5->Id * p->nFrames + i_00] = pAVar10;
      pAVar3 = p->pAig;
    }
    for (iVar11 = 0; iVar8 = i_00 + 1, iVar9 = i, iVar11 < pAVar3->nRegs; iVar11 = iVar11 + 1) {
      pAVar5 = Saig_ManLi(pAVar3,iVar11);
      pAVar10 = Saig_ManLo(p->pAig,iVar11);
      pAVar5 = p->pNodeToFrames[pAVar5->Id * p->nFrames + i_00];
      p->pNodeToFrames[p->nFrames * pAVar10->Id + i_00 + 1] = pAVar5;
      Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe));
      pAVar3 = p->pAig;
    }
  } while( true );
}

Assistant:

int Ssw_ManSweepBmcConstr( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int i, f, iLits;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );

    // build the constraint outputs
    iLits = 0;
    p->fRefined = 0;
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(p->pFrames);
            pObjNew->fPhase = Vec_IntEntry( p->vInits, iLits++ );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // build the constraint cones
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
                continue;
            pObjNew = Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObj), f );
            pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
            if ( Aig_Regular(pObjNew) == Aig_ManConst1(p->pFrames) )
            {
                assert( Aig_IsComplement(pObjNew) );
                continue;
            }
            Ssw_NodesAreConstrained( p, pObjNew, Aig_ManConst0(p->pFrames) );
        }        
        // sweep flops
        Saig_ManForEachLo( p->pAig, pObj, i )
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 1 );
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 1 );
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
            break;
        // transfer latch input to the latch outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    assert( Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig) );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return p->fRefined;
}